

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covenant.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  CFGProblem problem_;
  Options opts_;
  STATUS SVar1;
  options_description_easy_init *poVar2;
  typed_value<unsigned_int,_char> *ptVar3;
  typed_value<int,_char> *ptVar4;
  typed_value<covenant::AbstractMethod,_char> *ptVar5;
  typed_value<covenant::GeneralizationMethod,_char> *ptVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar8;
  basic_command_line_parser<char> *this;
  size_type sVar9;
  ostream *poVar10;
  any *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_type sVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  TerminalFactory *this_00;
  long *plVar14;
  string *this_01;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  long lVar19;
  undefined1 auStack_d78 [14];
  allocator local_d69;
  uint num_solutions;
  uint incr_witness;
  int freq_incr_witness;
  int shortest_witness;
  AbstractMethod abs;
  GeneralizationMethod gen;
  int max_cegar_iter;
  undefined1 uStack_d4c;
  undefined2 local_d4b;
  undefined1 local_d49;
  shared_ptr<covenant::TerminalFactory> tfac;
  undefined4 in_stack_fffffffffffff2c8;
  int iVar20;
  int iVar21;
  AbstractMethod AVar22;
  GeneralizationMethod GVar23;
  int iVar24;
  uint uVar25;
  StrParse input;
  CFGProblem problem;
  shared_ptr<covenant::TerminalFactory> local_c70;
  string header;
  key_type local_c40;
  string in;
  string local_b80 [2];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_b30 [144];
  string local_aa0 [32];
  positional_options_description p;
  options_description cmmdline_options;
  string local_9c8;
  options_description log;
  ifstream fd;
  pointer local_920;
  CFG local_910 [14];
  options_description cegar_params;
  options_description hidden_params;
  options_description config;
  CFGProblem local_90;
  
  max_cegar_iter = -1;
  gen = GREEDY;
  shortest_witness = 0;
  freq_incr_witness = -1;
  num_solutions = CYCLE_BREAKING;
  incr_witness = num_solutions;
  abs = num_solutions;
  std::__cxx11::string::string
            ((string *)&header,"Covenant: semi-decider for intersection of context-free languages\n"
             ,(allocator *)&fd);
  std::__cxx11::string::string
            ((string *)&fd,
             "Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n",
             (allocator *)&vm);
  std::__cxx11::string::append((string *)&header);
  std::__cxx11::string::~string((string *)&fd);
  std::__cxx11::string::string((string *)&fd,"Usage   : covenant [Options] file",(allocator *)&vm);
  std::__cxx11::string::append((string *)&header);
  std::__cxx11::string::~string((string *)&fd);
  std::__cxx11::string::string((string *)&fd,"General options ",(allocator *)&vm);
  boost::program_options::options_description::options_description(&config,(string *)&fd,0x50,0x28);
  std::__cxx11::string::~string((string *)&fd);
  _fd = (pointer)boost::program_options::options_description::add_options(&config);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&fd,"help,h","print help message");
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"dot",
                      "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements"
                     );
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"verbose,v","verbose mode");
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"stats,s","Show some statistics and exit");
  ptVar3 = boost::program_options::value<unsigned_int>(&num_solutions);
  _vm = 1;
  ptVar3 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar3,(uint *)&vm);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"solutions",(value_semantic *)ptVar3,
                      "enumerate up to n solutions (default n=1)");
  ptVar4 = boost::program_options::value<int>(&max_cegar_iter);
  _hidden_params = 0xffffffff;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar4,(int *)&hidden_params);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"iter,i",(value_semantic *)ptVar4,
                      "maximum number of CEGAR iterations (default no limit)");
  ptVar5 = boost::program_options::value<covenant::AbstractMethod>(&abs);
  _cegar_params = 1;
  ptVar5 = boost::program_options::typed_value<covenant::AbstractMethod,_char>::default_value
                     (ptVar5,(AbstractMethod *)&cegar_params);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"abs,a",(value_semantic *)ptVar5,
                      "choose abstraction method [sigma-star|cycle-breaking]");
  ptVar6 = boost::program_options::value<covenant::GeneralizationMethod>(&gen);
  _log = 0;
  ptVar6 = boost::program_options::typed_value<covenant::GeneralizationMethod,_char>::default_value
                     (ptVar6,(GeneralizationMethod *)&log);
  boost::program_options::options_description_easy_init::operator()
            (poVar2,"gen,g",(value_semantic *)ptVar6,"choose generalization method [greedy|max-gen]"
            );
  std::__cxx11::string::string((string *)&fd,"",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&hidden_params,(string *)&fd,0x50,0x28);
  std::__cxx11::string::~string((string *)&fd);
  _fd = (pointer)boost::program_options::options_description::add_options(&hidden_params);
  ptVar7 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&fd,"input-file",(value_semantic *)ptVar7,"input file"
            );
  std::__cxx11::string::string((string *)&fd,"(unsound) cegar options ",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&cegar_params,(string *)&fd,0x50,0x28);
  std::__cxx11::string::~string((string *)&fd);
  _fd = (pointer)boost::program_options::options_description::add_options(&cegar_params);
  ptVar4 = boost::program_options::value<int>(&shortest_witness);
  _vm = 0;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&vm);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&fd,"l",(value_semantic *)ptVar4,
                      "shortest length of the witness (default 0)");
  ptVar4 = boost::program_options::value<int>(&freq_incr_witness);
  _log = 0xffffffff;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&log);
  poVar2 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar2,"freq-incr-witness",(value_semantic *)ptVar4,
                      "how often increasing witnesses\' length");
  ptVar3 = boost::program_options::value<unsigned_int>(&incr_witness);
  _cmmdline_options = 1;
  ptVar3 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar3,(uint *)&cmmdline_options);
  boost::program_options::options_description_easy_init::operator()
            (poVar2,"delta-incr-witness",(value_semantic *)ptVar3,
             "how much witnesses\' length is incremented");
  std::__cxx11::string::string((string *)&fd,"Logging Options",(allocator *)&vm);
  boost::program_options::options_description::options_description(&log,(string *)&fd,0x50,0x28);
  std::__cxx11::string::~string((string *)&fd);
  _fd = (pointer)boost::program_options::options_description::add_options(&log);
  ptVar8 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&fd,"log",(value_semantic *)ptVar8,
             "Enable specified log level");
  boost::program_options::positional_options_description::positional_options_description(&p);
  boost::program_options::positional_options_description::add(&p,"input-file",-1);
  boost::program_options::options_description::options_description(&cmmdline_options,0x50,0x28);
  boost::program_options::options_description::add(&cmmdline_options,&config);
  boost::program_options::options_description::add(&cmmdline_options,&hidden_params);
  boost::program_options::options_description::add(&cmmdline_options,&cegar_params);
  boost::program_options::options_description::add(&cmmdline_options,&log);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&fd,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&fd,&cmmdline_options);
  boost::program_options::detail::cmdline::set_positional_options(&this->super_cmdline,&p);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&problem,this);
  boost::program_options::store((basic_parsed_options *)&problem,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&problem);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&fd);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&fd,"help",(allocator *)&problem);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_b30,(key_type *)&fd);
  std::__cxx11::string::~string((string *)&fd);
  if (sVar9 != 0) {
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)&header);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = (ostream *)boost::program_options::operator<<(poVar10,&config);
    std::endl<char,std::char_traits<char>>(poVar10);
    goto LAB_00144382;
  }
  in._M_dataplus._M_p = (pointer)&in.field_2;
  in._M_string_length = 0;
  in.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&fd,"input-file",(allocator *)&problem);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_b30,(key_type *)&fd);
  std::__cxx11::string::~string((string *)&fd);
  if (sVar9 == 0) {
LAB_00143db0:
    poVar10 = std::operator<<((ostream *)&std::cout,"Input file not found ");
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  else {
    std::__cxx11::string::string((string *)&fd,"input-file",(allocator *)&input);
    paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]
                               ((abstract_variables_map *)&vm,(string *)&fd);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
    std::__cxx11::string::string((string *)&problem,(string *)pbVar12);
    std::__cxx11::string::~string((string *)&fd);
    std::ifstream::ifstream(&fd);
    std::ifstream::open((char *)&fd,
                        (_Ios_Openmode)
                        problem.cns.
                        super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    lVar16 = *(long *)(_fd + -0x18);
    if (*(int *)((long)(&local_910[0].TrackedTerms.table_.
                         super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_> +
                       2) + lVar16 + 2) != 0) {
      std::ifstream::~ifstream(&fd);
      std::__cxx11::string::~string((string *)&problem);
      goto LAB_00143db0;
    }
    while ((*(byte *)((long)(&local_910[0].TrackedTerms.table_.
                              super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                            + 2) + lVar16 + 2) & 2) == 0) {
      input.str._M_dataplus._M_p = (pointer)0x0;
      input.str._M_string_length._0_1_ = 0;
      input._0_8_ = &input.str._M_string_length;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fd,(string *)&input);
      std::__cxx11::string::append((string *)&in);
      std::__cxx11::string::append((char *)&in);
      std::__cxx11::string::~string((string *)&input);
      lVar16 = *(long *)(_fd + -0x18);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&fd);
    std::__cxx11::string::~string((string *)&problem);
    std::__cxx11::string::string((string *)&fd,"dot",(allocator *)&problem);
    sVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_b30,(key_type *)&fd);
    std::__cxx11::string::~string((string *)&fd);
    std::__cxx11::string::string((string *)&fd,"verbose",(allocator *)&problem);
    sVar13 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_b30,(key_type *)&fd);
    std::__cxx11::string::~string((string *)&fd);
    if (sVar13 != 0) {
      std::__cxx11::string::string((string *)local_b80,"verbose",(allocator *)&fd);
      avy::AvyEnableLog(local_b80);
      std::__cxx11::string::~string((string *)local_b80);
    }
    std::__cxx11::string::string((string *)&fd,"log",(allocator *)&problem);
    sVar13 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_b30,(key_type *)&fd);
    std::__cxx11::string::~string((string *)&fd);
    if (sVar13 != 0) {
      std::__cxx11::string::string((string *)&fd,"log",(allocator *)&input);
      paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((abstract_variables_map *)&vm,(string *)&fd);
      __x = boost::
            any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                      (paVar11);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&problem,__x);
      std::__cxx11::string::~string((string *)&fd);
      uVar18 = 0;
      while( true ) {
        if ((ulong)((long)problem.cns.
                          super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)problem.cns.
                          super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar18) break;
        std::__cxx11::string::string
                  ((string *)&local_9c8,
                   (string *)
                   ((long)&((problem.cns.
                             super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start)->lang).TrackedTerms.table_.
                           super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                   + (ulong)uVar18 * 0x20 + -0x18));
        avy::AvyEnableLog(&local_9c8);
        std::__cxx11::string::~string((string *)&local_9c8);
        uVar18 = uVar18 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&problem);
    }
    iVar21 = shortest_witness;
    iVar20 = freq_incr_witness;
    AVar22 = abs;
    GVar23 = gen;
    iVar24 = max_cegar_iter;
    uVar18 = num_solutions;
    uVar25 = incr_witness;
    covenant::CFGProblem::CFGProblem(&problem);
    covenant::StrParse::StrParse(&input,&in);
    this_00 = (TerminalFactory *)operator_new(0x18);
    covenant::TerminalFactory::TerminalFactory(this_00);
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr<covenant::TerminalFactory>
              (&tfac,this_00);
    local_c70.px = tfac.px;
    local_c70.pn.pi_ = tfac.pn.pi_;
    if (tfac.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (tfac.pn.pi_)->use_count_ = (tfac.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
              (&problem,&input,&local_c70);
    boost::detail::shared_count::~shared_count(&local_c70.pn);
    if ((int)(((long)problem.cns.
                     super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)problem.cns.
                    super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x98) == 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"covenant: no CFGs found.");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    else {
      lVar19 = 0;
      for (lVar16 = 0;
          lVar16 < (int)(((long)problem.cns.
                                super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)problem.cns.
                               super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x98);
          lVar16 = lVar16 + 1) {
        covenant::CFGProblem::Constraint::Constraint
                  ((Constraint *)&fd,
                   (Constraint *)
                   ((long)(&((problem.cns.
                              super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->lang).TrackedTerms.table_.
                            super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                          + -8) + lVar19));
        if ((pointer)_fd == local_920) {
          this_01 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    (local_aa0,"expected at least one CFG",(allocator *)&local_c40);
          std::__cxx11::string::string(this_01,local_aa0);
          __cxa_throw(this_01,&covenant::error::typeinfo,covenant::error::~error);
        }
        covenant::CFG::check_well_formed(local_910);
        covenant::CFGProblem::Constraint::~Constraint((Constraint *)&fd);
        lVar19 = lVar19 + 0x98;
      }
      plVar14 = (long *)operator_new(8);
      *plVar14 = (long)&PTR__RegSolver_001bcf40;
      covenant::CFGProblem::CFGProblem(&local_90,&problem);
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = GVar23;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar24;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_1_ = sVar9 != 0;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = AVar22;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_finish._5_2_ = local_d4b;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = local_d49;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar20;
      problem_.cns.
      super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar21;
      problem_.var_table.table_._4_4_ = uVar18;
      problem_.var_table.table_._0_4_ = uVar25;
      problem_.var_table.table_._8_14_ = auStack_d78;
      problem_.var_table.table_.size_._6_1_ = sVar9 != 0;
      problem_.var_table.table_.size_._7_1_ = local_d69;
      problem_.var_table.table_.mlf_ = (float)num_solutions;
      problem_.var_table.table_._28_4_ = incr_witness;
      problem_.var_table.table_.max_load_._0_4_ = freq_incr_witness;
      problem_.var_table.table_.max_load_._4_4_ = shortest_witness;
      problem_.var_table.table_.buckets_._0_4_ = abs;
      problem_.var_table.table_.buckets_._4_4_ = gen;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = max_cegar_iter;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_1_ = uStack_d4c;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._5_2_ = local_d4b;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._7_1_ = local_d49;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)tfac.px;
      problem_.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tfac.pn.pi_;
      opts_.gen = iVar20;
      opts_.max_cegar_iter = in_stack_fffffffffffff2c8;
      opts_.abs = iVar21;
      opts_._12_4_ = AVar22;
      opts_.shortest_witness = GVar23;
      opts_.freq_incr_witness = iVar24;
      opts_.incr_witness = uVar18;
      opts_.num_solutions = uVar25;
      covenant::Solver<covenant::Sym>::Solver
                ((Solver<covenant::Sym> *)&fd,problem_,(reg_solver_t *)&local_90,opts_);
      covenant::CFGProblem::~CFGProblem(&local_90);
      covenant::Solver<covenant::Sym>::preprocess((Solver<covenant::Sym> *)&fd);
      std::__cxx11::string::string((string *)&local_c40,"stats",&local_d69);
      sVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_b30,&local_c40);
      std::__cxx11::string::~string((string *)&local_c40);
      if (sVar9 == 0) {
        SVar1 = covenant::Solver<covenant::Sym>::solve((Solver<covenant::Sym> *)&fd);
        pcVar15 = "======\nUNKNOWN\n======\n";
        if (SVar1 == UNSAT) {
          pcVar15 = "======\nUNSAT\n======\n";
        }
        pcVar17 = "======\nSAT\n======\n";
        if (SVar1 != SAT) {
          pcVar17 = pcVar15;
        }
        std::operator<<((ostream *)&std::cout,pcVar17);
      }
      else {
        covenant::Solver<covenant::Sym>::stats((Solver<covenant::Sym> *)&fd,(ostream *)&std::cout);
        (**(code **)(*plVar14 + 8))(plVar14);
      }
      covenant::Solver<covenant::Sym>::~Solver((Solver<covenant::Sym> *)&fd);
      if (sVar9 == 0) {
        (**(code **)(*plVar14 + 8))(plVar14);
      }
    }
    boost::detail::shared_count::~shared_count(&tfac.pn);
    std::__cxx11::string::~string((string *)&input.str);
    covenant::CFGProblem::~CFGProblem(&problem);
  }
  std::__cxx11::string::~string((string *)&in);
LAB_00144382:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&cmmdline_options);
  boost::program_options::positional_options_description::~positional_options_description(&p);
  boost::program_options::options_description::~options_description(&log);
  boost::program_options::options_description::~options_description(&cegar_params);
  boost::program_options::options_description::~options_description(&hidden_params);
  boost::program_options::options_description::~options_description(&config);
  std::__cxx11::string::~string((string *)&header);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  typedef Sym edge_sym_t;
  typedef Solver<edge_sym_t> solver_t;
  typedef RegSolver<edge_sym_t> reg_solver_t;

  // Main flags
  int max_cegar_iter=-1;
  GeneralizationMethod gen = GREEDY;
  AbstractMethod abs = CYCLE_BREAKING;
  // Heuristics flags
  // - regular solver will try to find a witness starting from this length
  int shortest_witness = 0;
  // - increase the witness length after n iterations -1 disable this option.
  int freq_incr_witness = -1;
  // - increment the witness length by n but only if freq_incr_witness >= 0
  unsigned incr_witness = 1;
  // Other flags
  bool is_dot_enabled=false;
  unsigned num_solutions = 1;

  string header("Covenant: semi-decider for intersection of context-free languages\n");
  header += string ("Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n");
  header += string ("Usage   : covenant [Options] file");

  po::options_description config("General options ");
  config.add_options()
      ("help,h", "print help message")
      ("dot" , 
       "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements")
      ("verbose,v" , "verbose mode")
      ("stats,s", "Show some statistics and exit")
      ("solutions" , po::value<unsigned>(&num_solutions)->default_value(1), 
       "enumerate up to n solutions (default n=1)")
      ("iter,i",  po::value<int>(&max_cegar_iter)->default_value(-1), 
       "maximum number of CEGAR iterations (default no limit)")
      ("abs,a",  po::value<AbstractMethod>(&abs)->default_value(CYCLE_BREAKING), 
       "choose abstraction method [sigma-star|cycle-breaking]")
      ("gen,g",  po::value<GeneralizationMethod>(&gen)->default_value(GREEDY), 
       "choose generalization method [greedy|max-gen]")
      ;

  po::options_description hidden_params("");
  hidden_params.add_options()
      ("input-file",  po::value<string>(), "input file")
      ;
      
  po::options_description cegar_params("(unsound) cegar options ");
  cegar_params.add_options()
      ("l",  po::value<int>(&shortest_witness)->default_value(0), 
       "shortest length of the witness (default 0)")
      ("freq-incr-witness",  po::value<int>(&freq_incr_witness)->default_value(-1), 
       "how often increasing witnesses' length")
      ("delta-incr-witness",  po::value<unsigned>(&incr_witness)->default_value(1), 
       "how much witnesses' length is incremented")
      ;

  po::options_description log("Logging Options");
  log.add_options()
      ("log",  po::value<std::vector<string> >(), "Enable specified log level")
      ;

  po::positional_options_description p;
  p.add("input-file", -1);

  po::options_description cmmdline_options;
  cmmdline_options.add(config);
  cmmdline_options.add(hidden_params);
  cmmdline_options.add(cegar_params);
  cmmdline_options.add(log);
  
  po::variables_map vm;

  try {
    po::store(po::command_line_parser(argc, argv).
              options(cmmdline_options).
              positional(p).
              run(), vm);
    po::notify(vm);    
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (vm.count("help"))
  {
    cout << header << endl << config << endl; 
    return 0;
  }  

  std::string in;
  bool file_opened = false;
  if (vm.count ("input-file"))
  {
    std::string infile = vm ["input-file"].as<std::string> ();
    std::ifstream fd;
    fd.open (infile.c_str ());
    if (fd.good ())
    {
      file_opened = true;
      while (!fd.eof ())
      {
        std::string line;
        getline(fd, line);
        in += line;
        in += "\n";
      }
      fd.close ();
    }
  }

  if (!file_opened)
  {
    cout << "Input file not found " << endl;
    return 0;
  }

  if (vm.count("dot"))
  {
    is_dot_enabled = true;
  }

  if (vm.count("verbose"))
  {
    avy::AvyEnableLog ("verbose");
  }

  // enable loggers
  if (vm.count("log"))
  {
    vector<string> loggers = vm ["log"].as<vector<string> > ();
    for(unsigned int i=0; i<loggers.size (); i++)
    {
      avy::AvyEnableLog (loggers [i]);
    }
  }

  solver_t::Options opts(max_cegar_iter, 
                         gen, 
                         abs, 
                         is_dot_enabled, 
                         shortest_witness, 
                         freq_incr_witness, 
                         incr_witness,
                         num_solutions);

  CFGProblem problem;
  StrParse input(in); 
  boost::shared_ptr<TerminalFactory> tfac (new TerminalFactory ());
  try
  {
    parse_problem(problem, input, tfac);
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (problem.size() == 0)
  {
    cerr << "covenant: no CFGs found." << endl;  
    return 0;
  }

  try
  {
    for(int ii = 0; ii < problem.size(); ii++)
    {
      CFGProblem::Constraint cn(problem[ii]);
      if (cn.vars.empty())
      {
        throw error("expected at least one CFG");
      }
      cn.lang.check_well_formed();
    }
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }
    
  reg_solver_t *regsolver = new Product<edge_sym_t>();
  try
  {
    solver_t s(problem, regsolver, opts);

    s.preprocess ();

    if (vm.count("stats"))
    {
      s.stats (cout);
      delete regsolver;
      return 0;
    }

    STATUS res = s.solve();

    switch (res)
    {
      case SAT:
        cout << "======\nSAT\n======\n";
        break;
      case UNSAT:
        cout << "======\nUNSAT\n======\n";
        break;
      default:
        cout << "======\nUNKNOWN\n======\n";  
        break;
    }
      
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
  }
  catch(Exit &e)
  {
    cerr << e << endl;
  }

  delete regsolver;

  return 0;
}